

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O2

uint Lpk_MapSuppRedDecSelect(Lpk_Man_t *p,uint *pTruth,int nVars,int *piVar,int *piVarReused)

{
  char cVar1;
  int iVar2;
  uint *pTruth_00;
  uint *pTruth_01;
  uint *pIn;
  Lpk_Set_t *pLVar3;
  uint uVar4;
  uint uVar5;
  Kit_DsdNtk_t *pKVar6;
  Kit_DsdNtk_t *p_00;
  Kit_DsdNtk_t *p_01;
  Lpk_Set_t *pLVar7;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  uint uVar11;
  Lpk_Set_t *pLVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  int nSets;
  int local_78;
  int local_74;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  uint *local_60;
  uint *local_58;
  Lpk_Man_t *local_50;
  uint *local_48;
  uint *local_40;
  uint *local_38;
  
  pVVar13 = p->vSets[0];
  pVVar9 = p->vSets[1];
  local_60 = (uint *)piVarReused;
  local_58 = (uint *)piVar;
  local_40 = (uint *)Vec_PtrEntry(p->vTtNodes,0);
  local_48 = (uint *)Vec_PtrEntry(p->vTtNodes,1);
  iVar2 = p->pPars->fVeryVerbose;
  local_50 = p;
  if (iVar2 != 0) {
    puts("\nExploring support-reducing bound-sets of function:");
    Kit_DsdPrintFromTruth(pTruth,nVars);
  }
  nSets = 0;
  local_74 = 0;
  if (0 < nVars) {
    local_74 = nVars;
  }
  local_78 = nVars;
  local_70 = pVVar13;
  local_68 = pVVar9;
  local_38 = pTruth;
  for (iVar14 = 0; pIn = local_38, local_74 != iVar14; iVar14 = iVar14 + 1) {
    if (iVar2 != 0) {
      printf("Evaluating variable %c:\n",(ulong)(iVar14 + 0x61));
    }
    pTruth_01 = local_40;
    Kit_TruthCofactor0New(local_40,pIn,nVars,iVar14);
    pTruth_00 = local_48;
    Kit_TruthCofactor1New(local_48,pIn,nVars,iVar14);
    pKVar6 = Kit_DsdDecompose(pTruth_01,nVars);
    p_00 = Kit_DsdDecompose(pTruth_00,nVars);
    p_01 = Kit_DsdExpand(pKVar6);
    Kit_DsdNtkFree(pKVar6);
    pKVar6 = Kit_DsdExpand(p_00);
    Kit_DsdNtkFree(p_00);
    pVVar13 = local_70;
    if (iVar2 == 0) {
      Lpk_ComputeSets(p_01,local_70);
      pVVar9 = local_68;
      Lpk_ComputeSets(pKVar6,local_68);
    }
    else {
      Kit_DsdPrint(_stdout,p_01);
      Kit_DsdPrint(_stdout,pKVar6);
      pVVar13 = local_70;
      Lpk_ComputeSets(p_01,local_70);
      pVVar9 = local_68;
      Lpk_ComputeSets(pKVar6,local_68);
      Lpk_PrintSets(pVVar13);
      Lpk_PrintSets(pVVar9);
    }
    Kit_DsdNtkFree(p_01);
    Kit_DsdNtkFree(pKVar6);
    nVars = local_78;
    Lpk_ComposeSets(pVVar13,pVVar9,local_78,iVar14,Lpk_MapSuppRedDecSelect::pStore,&nSets,0x100);
  }
  if (iVar2 == 0) {
    uVar15 = 0;
    if (0 < nSets) {
      uVar15 = (ulong)(uint)nSets;
    }
  }
  else {
    putchar(10);
    uVar8 = 0;
    uVar11 = nSets;
    if (nSets < 1) {
      uVar11 = 0;
    }
    uVar15 = (ulong)uVar11;
    pLVar12 = Lpk_MapSuppRedDecSelect::pStore;
    for (; uVar15 != uVar8; uVar8 = uVar8 + 1) {
      Lpk_MapSuppPrintSet(pLVar12,(int)uVar8);
      pLVar12 = pLVar12 + 1;
    }
  }
  Lpk_MapSuppRedDecSelect::pSetBest = (Lpk_Set_t *)0x0;
  pLVar12 = (Lpk_Set_t *)0x0;
  iVar14 = 0;
  pLVar3 = Lpk_MapSuppRedDecSelect::pStore;
  while (pLVar7 = pLVar3, bVar16 = uVar15 != 0, uVar15 = uVar15 - 1, bVar16) {
    iVar10 = (int)pLVar7->Size;
    if (iVar14 < iVar10 && iVar10 < local_50->pPars->nLutSize) {
      pLVar12 = pLVar7;
      iVar14 = iVar10;
      Lpk_MapSuppRedDecSelect::pSetBest = pLVar7;
    }
    pLVar3 = pLVar7 + 1;
    Lpk_MapSuppRedDecSelect::pSet = pLVar7;
  }
  if (pLVar12 == (Lpk_Set_t *)0x0) {
    uVar11 = 0;
    if (iVar2 != 0) {
      puts("Could not select a subset.");
      uVar11 = 0;
    }
  }
  else {
    if (iVar2 != 0) {
      puts("Selected the following subset:");
      Lpk_MapSuppPrintSet(Lpk_MapSuppRedDecSelect::pSetBest,
                          (int)((long)&Lpk_MapSuppRedDecSelect::pSetBest[-0x10cd5e].uSubset1 / 0xc))
      ;
      pLVar12 = Lpk_MapSuppRedDecSelect::pSetBest;
    }
    uVar11 = pLVar12->uSubset1;
    uVar5 = pLVar12->uSubset0;
    uVar4 = Kit_BitMask(nVars);
    pLVar12 = Lpk_MapSuppRedDecSelect::pSetBest;
    cVar1 = Lpk_MapSuppRedDecSelect::pSetBest->iVar;
    uVar4 = ~((uVar11 | uVar5) >> 0x10 | 1 << ((int)cVar1 & 0x1fU)) & uVar4;
    if (uVar4 == 0) {
      __assert_fail("Entry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                    ,0x1b0,
                    "unsigned int Lpk_MapSuppRedDecSelect(Lpk_Man_t *, unsigned int *, int, int *, int *)"
                   );
    }
    for (uVar11 = 0;
        (uVar5 = 0xffffffff, uVar11 != 0x20 && (uVar5 = uVar11, (uVar4 >> (uVar11 & 0x1f) & 1) == 0)
        ); uVar11 = uVar11 + 1) {
    }
    *local_60 = uVar5;
    *local_58 = (int)cVar1;
    uVar11 = (uint)(ushort)pLVar12->uSubset0 | pLVar12->uSubset1 << 0x10;
  }
  return uVar11;
}

Assistant:

unsigned Lpk_MapSuppRedDecSelect( Lpk_Man_t * p, unsigned * pTruth, int nVars, int * piVar, int * piVarReused )
{
    static int nStoreSize = 256;
    static Lpk_Set_t pStore[256], * pSet, * pSetBest;
    Kit_DsdNtk_t * ppNtks[2], * pTemp;
    Vec_Int_t * vSets0 = p->vSets[0];
    Vec_Int_t * vSets1 = p->vSets[1];
    unsigned * pCof0 = (unsigned *)Vec_PtrEntry( p->vTtNodes, 0 );
    unsigned * pCof1 = (unsigned *)Vec_PtrEntry( p->vTtNodes, 1 );
    int nSets, i, SizeMax;//, SRedMax;
    unsigned Entry;
    int fVerbose = p->pPars->fVeryVerbose;
//    int fVerbose = 0;

    // collect decomposable subsets for each pair of cofactors
    if ( fVerbose )
    {
        printf( "\nExploring support-reducing bound-sets of function:\n" );
        Kit_DsdPrintFromTruth( pTruth, nVars );
    }
    nSets = 0;
    for ( i = 0; i < nVars; i++ )
    {
        if ( fVerbose )
        printf( "Evaluating variable %c:\n", 'a'+i );
        // evaluate the cofactor pair
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, i );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, i );
        // decompose and expand
        ppNtks[0] = Kit_DsdDecompose( pCof0, nVars );
        ppNtks[1] = Kit_DsdDecompose( pCof1, nVars );
        ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );      Kit_DsdNtkFree( pTemp );
        ppNtks[1] = Kit_DsdExpand( pTemp = ppNtks[1] );      Kit_DsdNtkFree( pTemp );
        if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[0] );
        if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[1] );
        // compute subsets
        Lpk_ComputeSets( ppNtks[0], vSets0 );
        Lpk_ComputeSets( ppNtks[1], vSets1 );
        // print subsets
        if ( fVerbose )
        Lpk_PrintSets( vSets0 );
        if ( fVerbose )
        Lpk_PrintSets( vSets1 );
        // free the networks
        Kit_DsdNtkFree( ppNtks[0] );
        Kit_DsdNtkFree( ppNtks[1] );
        // evaluate the pair
        Lpk_ComposeSets( vSets0, vSets1, nVars, i, pStore, &nSets, nStoreSize );
    }

    // print the results
    if ( fVerbose )
    printf( "\n" );
    if ( fVerbose )
    for ( i = 0; i < nSets; i++ )
        Lpk_MapSuppPrintSet( pStore + i, i );

    // choose the best subset
    SizeMax = 0;
    pSetBest = NULL;
    for ( i = 0; i < nSets; i++ )
    {
        pSet = pStore + i;
        if ( pSet->Size > p->pPars->nLutSize - 1 )
            continue;
        if ( SizeMax < pSet->Size )
        {
            pSetBest = pSet;
            SizeMax = pSet->Size;
        }
    }
/*
    // if the best is not choosen, select the one with largest reduction
    SRedMax = 0;
    if ( pSetBest == NULL )
    {
        for ( i = 0; i < nSets; i++ )
        {
            pSet = pStore + i;
            if ( SRedMax < pSet->SRed )
            {
                pSetBest = pSet;
                SRedMax = pSet->SRed;
            }
        }
    }
*/
    if ( pSetBest == NULL )
    {
        if ( fVerbose )
        printf( "Could not select a subset.\n" );
        return 0;
    }
    else
    {
        if ( fVerbose )
        printf( "Selected the following subset:\n" );
        if ( fVerbose )
        Lpk_MapSuppPrintSet( pSetBest, pSetBest - pStore );
    }

    // prepare the return result
    // get the remaining variables
    Entry = ((pSetBest->uSubset0 >> 16) | (pSetBest->uSubset1 >> 16));
    // get the variables to be removed
    Entry = Kit_BitMask(nVars) & ~(1<<pSetBest->iVar) & ~Entry;
    // make sure there are some - otherwise it is not supp-red
    assert( Entry );
    // remember the first such variable
    *piVarReused = Kit_WordFindFirstBit( Entry );
    *piVar = pSetBest->iVar;
    return (pSetBest->uSubset1 << 16) | (pSetBest->uSubset0 & 0xFFFF);
}